

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_dup64_mips64(void *d,uint32_t desc,uint64_t c)

{
  ulong uVar1;
  ulong uVar2;
  
  if (c == 0) {
    clear_high(d,0,desc);
    return;
  }
  uVar2 = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 8) {
    *(uint64_t *)((long)d + uVar1) = c;
  }
  uVar1 = (ulong)((desc >> 2 & 0xf8) + 8);
  if (uVar2 < uVar1) {
    for (; (long)uVar2 < (long)uVar1; uVar2 = uVar2 + 8) {
      *(undefined8 *)((long)d + uVar2) = 0;
    }
  }
  return;
}

Assistant:

void HELPER(gvec_dup64)(void *d, uint32_t desc, uint64_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
            *(uint64_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}